

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integral_helper.h
# Opt level: O2

void printXYAsMathematicaList<long_double>
               (vector<long_double,_std::allocator<long_double>_> *values)

{
  ostream *poVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  lVar3 = (long)(values->super__Vector_base<long_double,_std::allocator<long_double>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(values->super__Vector_base<long_double,_std::allocator<long_double>_>)._M_impl.
                super__Vector_impl_data._M_start;
  lVar2 = lVar3 >> 4;
  std::operator<<((ostream *)&std::cout,"{");
  lVar4 = 0;
  if (lVar2 < 1) {
    lVar2 = lVar4;
  }
  for (; lVar2 * 2 != lVar4; lVar4 = lVar4 + 2) {
    if (lVar4 != 0) {
      std::operator<<((ostream *)&std::cout,",");
    }
    std::operator<<((ostream *)&std::cout,"{");
    poVar1 = std::ostream::_M_insert<double>((double)(lVar4 + 1) / (double)(lVar3 >> 3));
    std::operator<<(poVar1,",");
    poVar1 = std::ostream::_M_insert<long_double>
                       (*(longdouble *)
                         ((long)(values->
                                super__Vector_base<long_double,_std::allocator<long_double>_>).
                                _M_impl.super__Vector_impl_data._M_start + lVar4 * 8));
    std::operator<<(poVar1,"}");
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"}");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void printXYAsMathematicaList(const vector<Num> &values) {
	long L = values.size();
	cout << "{";
	for (long i = 0; i < L; ++i) {
		if (i > 0) cout << ",";
		cout << "{" << alphaForIndex<double>(i, L) << "," << values[i] << "}";
	}
	cout << "}" << endl;
}